

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O1

FeatureDescriptor * __thiscall
cmComputeLinkInformation::GetGroupFeature(cmComputeLinkInformation *this,string *feature)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  cmake *pcVar4;
  bool bVar5;
  iterator iVar6;
  cmValue cVar7;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>
  _Var8;
  string *psVar9;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *pcVar10;
  element_type *peVar11;
  _Base_ptr p_Var12;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>,_bool>
  pVar13;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  string_view value;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_05;
  string featureName;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  items;
  string local_198;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
  *local_178;
  undefined1 local_170 [16];
  undefined1 local_160 [40];
  undefined1 local_138 [24];
  cmMakefile *local_120;
  undefined1 local_118 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  _Alloc_hider local_e8;
  _Base_ptr local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [24];
  long local_a0;
  undefined1 local_90 [32];
  string local_70;
  undefined1 local_50 [32];
  
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
          ::find(&(this->GroupFeatureDescriptors)._M_t,feature);
  if ((_Rb_tree_header *)iVar6._M_node !=
      &(this->GroupFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header) {
    p_Var12 = iVar6._M_node + 1;
    goto LAB_0047048d;
  }
  local_170._0_8_ = (element_type *)0x6;
  local_170._8_8_ = "CMAKE_";
  local_160._0_8_ = (cmLocalGenerator *)0x0;
  local_160._16_8_ = (this->LinkLanguage)._M_dataplus._M_p;
  local_160._8_8_ = (this->LinkLanguage)._M_string_length;
  local_160._24_8_ = (pointer)0x0;
  local_160._32_8_ = 0x12;
  local_138._0_8_ = (long)"CMAKE_LINK_GROUP_USING_" + 5;
  local_138._8_8_ = 0;
  local_120 = (cmMakefile *)(feature->_M_dataplus)._M_p;
  local_138._16_8_ = feature->_M_string_length;
  local_118._0_8_ = (pointer)0x0;
  views._M_len = 4;
  views._M_array = (iterator)local_170;
  local_178 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
               *)&this->GroupFeatureDescriptors;
  cmCatViews((string *)(local_d8 + 0x10),views);
  pcVar2 = this->Makefile;
  local_170._0_8_ = local_c8._8_8_;
  local_170._8_8_ = local_c8._0_8_;
  local_160._0_8_ = (cmLocalGenerator *)0x0;
  local_160._8_8_ = (cmGlobalGenerator *)0xa;
  local_160._16_8_ = (long)"CMAKE_CUDA_PIE_SUPPORTED" + 0xe;
  local_160._24_8_ = (pointer)0x0;
  views_00._M_len = 2;
  views_00._M_array = (iterator)local_170;
  cmCatViews(&local_198,views_00);
  cVar7 = cmMakefile::GetDefinition(pcVar2,&local_198);
  paVar1 = &local_198.field_2;
  pcVar10 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar1) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
    pcVar10 = extraout_RDX_00;
  }
  if (cVar7.Value == (string *)0x0) {
    local_170._0_8_ = (element_type *)0x17;
    local_170._8_8_ = "CMAKE_LINK_GROUP_USING_";
    local_160._0_8_ = (cmLocalGenerator *)0x0;
    local_160._16_8_ = (feature->_M_dataplus)._M_p;
    local_160._8_8_ = feature->_M_string_length;
    local_160._24_8_ = (pointer)0x0;
    views_01._M_len = 2;
    views_01._M_array = (iterator)local_170;
    cmCatViews(&local_198,views_01);
    std::__cxx11::string::operator=((string *)(local_d8 + 0x10),(string *)&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != paVar1) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = this->Makefile;
    local_170._0_8_ = local_c8._8_8_;
    local_170._8_8_ = local_c8._0_8_;
    local_160._0_8_ = (cmLocalGenerator *)0x0;
    local_160._8_8_ = (cmGlobalGenerator *)0xa;
    local_160._16_8_ = (long)"CMAKE_CUDA_PIE_SUPPORTED" + 0xe;
    local_160._24_8_ = (pointer)0x0;
    views_02._M_len = 2;
    views_02._M_array = (iterator)local_170;
    cmCatViews(&local_198,views_02);
    cVar7 = cmMakefile::GetDefinition(pcVar2,&local_198);
    pcVar10 = extraout_RDX_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != paVar1) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      pcVar10 = extraout_RDX_02;
    }
  }
  if ((cVar7.Value == (string *)0x0) ||
     (value._M_str = pcVar10, value._M_len = (size_t)((cVar7.Value)->_M_dataplus)._M_p,
     bVar5 = cmValue::IsOn((cmValue *)(cVar7.Value)->_M_string_length,value), !bVar5)) {
    pcVar4 = this->CMakeInstance;
    psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    local_170._0_8_ = (element_type *)0x9;
    local_170._8_8_ = "Feature \'";
    local_160._0_8_ = (cmLocalGenerator *)0x0;
    local_160._16_8_ = (feature->_M_dataplus)._M_p;
    local_160._8_8_ = feature->_M_string_length;
    local_160._24_8_ = (pointer)0x0;
    local_160._32_8_ = 0x4a;
    local_138._0_8_ =
         "\', specified through generator-expression \'$<LINK_GROUP>\' to link target \'";
    local_138._8_8_ = 0;
    local_120 = (cmMakefile *)(psVar9->_M_dataplus)._M_p;
    local_138._16_8_ = psVar9->_M_string_length;
    local_118._0_8_ = (pointer)0x0;
    local_118._8_8_ = (_Base_ptr)0x1d;
    local_118._16_8_ = "\', is not supported for the \'";
    local_118._24_8_ = 0;
    local_f8._8_8_ = (this->LinkLanguage)._M_dataplus._M_p;
    local_f8._M_allocated_capacity = (this->LinkLanguage)._M_string_length;
    local_e8._M_p = (pointer)0x0;
    local_e0 = (_Base_ptr)0x10;
    local_d8._0_8_ = "\' link language.";
    local_d8._8_8_ = 0;
    views_03._M_len = 7;
    views_03._M_array = (iterator)local_170;
    cmCatViews(&local_198,views_03);
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_170);
    cmake::IssueMessage(pcVar4,FATAL_ERROR,&local_198,(cmListFileBacktrace *)local_170);
    if ((cmMakefile *)local_170._8_8_ != (cmMakefile *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != paVar1) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
    }
    memset(local_170,0,0xa8);
    local_170._0_8_ = local_160;
    local_170._8_8_ = (cmMakefile *)0x0;
    local_160._0_8_ = local_160._0_8_ & 0xffffffffffffff00;
    local_160._16_8_ = local_160._16_8_ & 0xffffffffffffff00;
    local_160._24_8_ = local_138;
    local_160._32_8_ = 0;
    local_138._0_8_ = local_138._0_8_ & 0xffffffffffffff00;
    local_138._16_8_ = local_118;
    local_120 = (cmMakefile *)0x0;
    local_118._0_8_ = local_118._0_8_ & 0xffffffffffffff00;
    local_118._16_8_ = &local_f8;
    local_118._24_8_ = 0;
    local_f8._M_allocated_capacity = local_f8._M_allocated_capacity & 0xffffffffffffff00;
    local_e8._M_p = local_d8;
    local_e0 = (_Base_ptr)0x0;
    local_d8._0_8_ = local_d8._0_8_ & 0xffffffffffffff00;
    pVar13 = std::
             _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
             ::
             _M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                       (local_178,feature,(FeatureDescriptor *)local_170);
    _Var8 = pVar13.first._M_node;
LAB_004703de:
    if ((_Base_ptr)local_e8._M_p != (_Base_ptr)local_d8) {
      operator_delete(local_e8._M_p,local_d8._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._16_8_ != &local_f8) {
      operator_delete((void *)local_118._16_8_,local_f8._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_138._16_8_ != local_118) {
      operator_delete((void *)local_138._16_8_,(ulong)(local_118._0_8_ + 1));
    }
    if ((undefined1 *)local_160._24_8_ != local_138) {
      operator_delete((void *)local_160._24_8_,(ulong)(local_138._0_8_ + 1));
    }
    if ((element_type *)local_170._0_8_ != (element_type *)local_160) {
      operator_delete((void *)local_170._0_8_,(ulong)(local_160._0_8_ + 1));
    }
  }
  else {
    cVar7 = cmMakefile::GetDefinition(this->Makefile,(string *)(local_d8 + 0x10));
    if (cVar7.Value == (string *)0x0) {
      pcVar4 = this->CMakeInstance;
      psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
      local_170._0_8_ = (element_type *)0x9;
      local_170._8_8_ = "Feature \'";
      local_160._0_8_ = (cmLocalGenerator *)0x0;
      local_160._16_8_ = (feature->_M_dataplus)._M_p;
      local_160._8_8_ = feature->_M_string_length;
      local_160._24_8_ = (pointer)0x0;
      local_160._32_8_ = 0x4a;
      local_138._0_8_ =
           "\', specified through generator-expression \'$<LINK_GROUP>\' to link target \'";
      local_138._8_8_ = 0;
      local_120 = (cmMakefile *)(psVar9->_M_dataplus)._M_p;
      local_138._16_8_ = psVar9->_M_string_length;
      local_118._0_8_ = (pointer)0x0;
      local_118._8_8_ = (_Base_ptr)0x1b;
      local_118._16_8_ = "\', is not defined for the \'";
      local_118._24_8_ = 0;
      local_f8._8_8_ = (this->LinkLanguage)._M_dataplus._M_p;
      local_f8._M_allocated_capacity = (this->LinkLanguage)._M_string_length;
      local_e8._M_p = (pointer)0x0;
      local_e0 = (_Base_ptr)0x10;
      local_d8._0_8_ = "\' link language.";
      local_d8._8_8_ = 0;
      views_04._M_len = 7;
      views_04._M_array = (iterator)local_170;
      cmCatViews(&local_198,views_04);
      cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_170);
      cmake::IssueMessage(pcVar4,FATAL_ERROR,&local_198,(cmListFileBacktrace *)local_170);
      if ((cmMakefile *)local_170._8_8_ != (cmMakefile *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != paVar1) {
        operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      }
      memset(local_170,0,0xa8);
      local_170._0_8_ = local_160;
      local_170._8_8_ = (cmMakefile *)0x0;
      local_160._0_8_ = local_160._0_8_ & 0xffffffffffffff00;
      local_160._16_8_ = local_160._16_8_ & 0xffffffffffffff00;
      local_160._24_8_ = local_138;
      local_160._32_8_ = 0;
      local_138._0_8_ = local_138._0_8_ & 0xffffffffffffff00;
      local_138._16_8_ = local_118;
      local_120 = (cmMakefile *)0x0;
      local_118._0_8_ = local_118._0_8_ & 0xffffffffffffff00;
      local_118._16_8_ = &local_f8;
      local_118._24_8_ = 0;
      local_f8._M_allocated_capacity = local_f8._M_allocated_capacity & 0xffffffffffffff00;
      local_e8._M_p = local_d8;
      local_e0 = (_Base_ptr)0x0;
      local_d8._0_8_ = local_d8._0_8_ & 0xffffffffffffff00;
      pVar13 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
               ::
               _M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                         (local_178,feature,(FeatureDescriptor *)local_170);
      _Var8 = pVar13.first._M_node;
      goto LAB_004703de;
    }
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_170);
    cmExpandListWithBacktrace
              ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(local_b8 + 0x10),cVar7.Value,(cmListFileBacktrace *)local_170,Yes);
    if ((cmMakefile *)local_170._8_8_ != (cmMakefile *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_);
    }
    cmGeneratorTarget::ResolveLinkerWrapper
              (this->Target,
               (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(local_b8 + 0x10),&this->LinkLanguage,true);
    if (local_a0 - local_b8._16_8_ == 0x60) {
      pcVar3 = (feature->_M_dataplus)._M_p;
      local_50._0_8_ = (element_type *)(local_50 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,pcVar3,pcVar3 + feature->_M_string_length);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,*(long *)local_b8._16_8_,
                 *(long *)local_b8._16_8_ + *(long *)(local_b8._16_8_ + 8));
      local_90._0_8_ = (_Base_ptr)(local_90 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,*(long *)(local_b8._16_8_ + 0x30),
                 *(long *)(local_b8._16_8_ + 0x30) + *(long *)(local_b8._16_8_ + 0x38));
      GroupFeatureDescriptor::GroupFeatureDescriptor
                ((GroupFeatureDescriptor *)local_170,(string *)local_50,&local_70,(string *)local_90
                );
      pVar13 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
               ::
               _M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::GroupFeatureDescriptor>
                         (local_178,feature,(GroupFeatureDescriptor *)local_170);
      _Var8 = pVar13.first._M_node;
      if ((_Base_ptr)local_e8._M_p != (_Base_ptr)local_d8) {
        operator_delete(local_e8._M_p,local_d8._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._16_8_ != &local_f8) {
        operator_delete((void *)local_118._16_8_,local_f8._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_138._16_8_ != local_118) {
        operator_delete((void *)local_138._16_8_,(ulong)(local_118._0_8_ + 1));
      }
      if ((undefined1 *)local_160._24_8_ != local_138) {
        operator_delete((void *)local_160._24_8_,(ulong)(local_138._0_8_ + 1));
      }
      if ((element_type *)local_170._0_8_ != (element_type *)local_160) {
        operator_delete((void *)local_170._0_8_,(ulong)(local_160._0_8_ + 1));
      }
      if ((_Base_ptr)local_90._0_8_ != (_Base_ptr)(local_90 + 0x10)) {
        operator_delete((void *)local_90._0_8_,(ulong)(local_90._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,
                        (ulong)(local_70.field_2._M_allocated_capacity + 1));
      }
      peVar11 = (element_type *)local_50._0_8_;
      if ((element_type *)local_50._0_8_ != (element_type *)(local_50 + 0x10)) {
LAB_00470875:
        operator_delete(peVar11,(ulong)((long)&(((cmLocalGenerator *)local_50._16_8_)->
                                               super_cmOutputConverter)._vptr_cmOutputConverter + 1)
                       );
      }
    }
    else {
      pcVar4 = this->CMakeInstance;
      psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
      local_170._0_8_ = (element_type *)0x9;
      local_170._8_8_ = "Feature \'";
      local_160._0_8_ = (cmLocalGenerator *)0x0;
      local_160._16_8_ = (feature->_M_dataplus)._M_p;
      local_160._8_8_ = feature->_M_string_length;
      local_160._24_8_ = (pointer)0x0;
      local_160._32_8_ = 0x1a;
      local_138._0_8_ = "\', specified by variable \'";
      local_138._8_8_ = 0;
      local_138._16_8_ = local_c8._8_8_;
      local_120 = (cmMakefile *)local_c8._0_8_;
      local_118._0_8_ = (pointer)0x0;
      local_118._8_8_ = (_Base_ptr)0x4e;
      local_118._16_8_ =
           "\', is malformed (wrong number of elements) and cannot be used to link target \'";
      local_118._24_8_ = 0;
      local_f8._8_8_ = (psVar9->_M_dataplus)._M_p;
      local_f8._M_allocated_capacity = psVar9->_M_string_length;
      local_e8._M_p = (pointer)0x0;
      local_e0 = (_Base_ptr)0x2;
      local_d8._0_8_ = (long)"\nmay not start with \'-\'." + 0x16;
      local_d8._8_8_ = 0;
      views_05._M_len = 7;
      views_05._M_array = (iterator)local_170;
      cmCatViews(&local_198,views_05);
      cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_170);
      cmake::IssueMessage(pcVar4,FATAL_ERROR,&local_198,(cmListFileBacktrace *)local_170);
      if ((cmMakefile *)local_170._8_8_ != (cmMakefile *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != paVar1) {
        operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      }
      memset(local_170,0,0xa8);
      local_170._0_8_ = local_160;
      local_170._8_8_ = (cmMakefile *)0x0;
      local_160._0_8_ = local_160._0_8_ & 0xffffffffffffff00;
      local_160._16_8_ = local_160._16_8_ & 0xffffffffffffff00;
      local_160._32_8_ = 0;
      local_138._0_8_ = local_138._0_8_ & 0xffffffffffffff00;
      local_120 = (cmMakefile *)0x0;
      local_118._0_8_ = local_118._0_8_ & 0xffffffffffffff00;
      local_118._24_8_ = 0;
      local_f8._M_allocated_capacity = local_f8._M_allocated_capacity & 0xffffffffffffff00;
      local_e0 = (_Base_ptr)0x0;
      local_d8._0_8_ = local_d8._0_8_ & 0xffffffffffffff00;
      local_160._24_8_ = local_138;
      local_138._16_8_ = local_118;
      local_118._16_8_ = &local_f8;
      local_e8._M_p = (pointer)local_d8;
      pVar13 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
               ::
               _M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                         (local_178,feature,(FeatureDescriptor *)local_170);
      _Var8 = pVar13.first._M_node;
      if ((_Base_ptr)local_e8._M_p != (_Base_ptr)local_d8) {
        operator_delete(local_e8._M_p,local_d8._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._16_8_ != &local_f8) {
        operator_delete((void *)local_118._16_8_,local_f8._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_138._16_8_ != local_118) {
        operator_delete((void *)local_138._16_8_,(ulong)(local_118._0_8_ + 1));
      }
      if ((undefined1 *)local_160._24_8_ != local_138) {
        operator_delete((void *)local_160._24_8_,(ulong)(local_138._0_8_ + 1));
      }
      local_50._16_8_ = local_160._0_8_;
      peVar11 = (element_type *)local_170._0_8_;
      if ((element_type *)local_170._0_8_ != (element_type *)local_160) goto LAB_00470875;
    }
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_b8 + 0x10));
  }
  p_Var12 = _Var8._M_node + 1;
  if ((cmMakefile *)local_c8._0_8_ != (cmMakefile *)(local_c8 + 0x10)) {
    operator_delete((void *)local_c8._0_8_,(ulong)((long)(_Rb_tree_color *)local_b8._0_8_ + 1));
  }
LAB_0047048d:
  return (FeatureDescriptor *)(p_Var12 + 1);
}

Assistant:

cmComputeLinkInformation::FeatureDescriptor const&
cmComputeLinkInformation::GetGroupFeature(std::string const& feature)
{
  auto it = this->GroupFeatureDescriptors.find(feature);
  if (it != this->GroupFeatureDescriptors.end()) {
    return it->second;
  }

  auto featureName =
    cmStrCat("CMAKE_", this->LinkLanguage, "_LINK_GROUP_USING_", feature);
  cmValue featureSupported =
    this->Makefile->GetDefinition(cmStrCat(featureName, "_SUPPORTED"));
  if (!featureSupported) {
    // language specific variable is not defined, fallback to the more generic
    // one
    featureName = cmStrCat("CMAKE_LINK_GROUP_USING_", feature);
    featureSupported =
      this->Makefile->GetDefinition(cmStrCat(featureName, "_SUPPORTED"));
  }
  if (!featureSupported.IsOn()) {
    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Feature '", feature,
               "', specified through generator-expression '$<LINK_GROUP>' to "
               "link target '",
               this->Target->GetName(), "', is not supported for the '",
               this->LinkLanguage, "' link language."),
      this->Target->GetBacktrace());
    return this->GroupFeatureDescriptors.emplace(feature, FeatureDescriptor{})
      .first->second;
  }

  cmValue langFeature = this->Makefile->GetDefinition(featureName);
  if (!langFeature) {
    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Feature '", feature,
               "', specified through generator-expression '$<LINK_GROUP>' to "
               "link target '",
               this->Target->GetName(), "', is not defined for the '",
               this->LinkLanguage, "' link language."),
      this->Target->GetBacktrace());
    return this->GroupFeatureDescriptors.emplace(feature, FeatureDescriptor{})
      .first->second;
  }

  auto items = cmExpandListWithBacktrace(
    *langFeature, this->Target->GetBacktrace(), cmList::EmptyElements::Yes);

  // replace LINKER: pattern
  this->Target->ResolveLinkerWrapper(items, this->LinkLanguage, true);

  if (items.size() == 2) {
    return this->GroupFeatureDescriptors
      .emplace(
        feature,
        GroupFeatureDescriptor{ feature, items[0].Value, items[1].Value })
      .first->second;
  }

  this->CMakeInstance->IssueMessage(
    MessageType::FATAL_ERROR,
    cmStrCat("Feature '", feature, "', specified by variable '", featureName,
             "', is malformed (wrong number of elements) and cannot be used "
             "to link target '",
             this->Target->GetName(), "'."),
    this->Target->GetBacktrace());
  return this->GroupFeatureDescriptors.emplace(feature, FeatureDescriptor{})
    .first->second;
}